

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::python::Generator::
PrintSerializedPbInterval<google::protobuf::ServiceDescriptorProto>
          (Generator *this,ServiceDescriptorProto *descriptor_proto,string_view name)

{
  Printer *this_00;
  unsigned_long x;
  string *psVar1;
  AlphaNum *a;
  AlphaNum *a_00;
  string_view text;
  string sp;
  string_view name_local;
  AlphaNum local_b8;
  string local_88;
  string local_68;
  AlphaNum local_48;
  
  name_local._M_str = name._M_str;
  name_local._M_len = name._M_len;
  sp._M_dataplus._M_p = (pointer)&sp.field_2;
  sp._M_string_length = 0;
  sp.field_2._M_local_buf[0] = '\0';
  google::protobuf::MessageLite::SerializeToString((string *)descriptor_proto);
  x = std::__cxx11::string::find((string *)&this->file_descriptor_serialized_,(ulong)&sp);
  local_48.piece_._M_len._0_4_ = 0;
  local_b8.piece_._M_len = x;
  psVar1 = absl::lts_20240722::log_internal::Check_GEImpl<unsigned_long,int>
                     ((unsigned_long *)&local_b8,(int *)&local_48,"offset >= 0");
  if (psVar1 == (string *)0x0) {
    this_00 = this->printer_;
    absl::lts_20240722::AlphaNum::AlphaNum(&local_b8,x);
    absl::lts_20240722::StrCat_abi_cxx11_(&local_68,(lts_20240722 *)&local_b8,a);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_48,x + sp._M_string_length);
    absl::lts_20240722::StrCat_abi_cxx11_(&local_88,(lts_20240722 *)&local_48,a_00);
    text._M_str = 
    "_globals[\'$name$\']._serialized_start=$serialized_start$\n_globals[\'$name$\']._serialized_end=$serialized_end$\n"
    ;
    text._M_len = 0x6c;
    io::Printer::
    Print<char[5],std::basic_string_view<char,std::char_traits<char>>,char[17],std::__cxx11::string,char[15],std::__cxx11::string>
              (this_00,text,(char (*) [5])0x3f02df,&name_local,(char (*) [17])"serialized_start",
               &local_68,(char (*) [15])"serialized_end",&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&sp);
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_b8,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/compiler/python/generator.cc"
             ,0x51d,psVar1->_M_string_length,(psVar1->_M_dataplus)._M_p);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_b8);
}

Assistant:

void Generator::PrintSerializedPbInterval(
    const DescriptorProtoT& descriptor_proto, absl::string_view name) const {
  std::string sp;
  descriptor_proto.SerializeToString(&sp);
  size_t offset = file_descriptor_serialized_.find(sp);
  ABSL_CHECK_GE(offset, 0);

  printer_->Print(
      "_globals['$name$']._serialized_start=$serialized_start$\n"
      "_globals['$name$']._serialized_end=$serialized_end$\n",
      "name", name, "serialized_start", absl::StrCat(offset), "serialized_end",
      absl::StrCat(offset + sp.size()));
}